

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

void src_float_to_int_array(float *in,int *out,int len)

{
  int iVar1;
  double x;
  int local_2c;
  int i;
  double scaled_value;
  int len_local;
  int *out_local;
  float *in_local;
  
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    x = (double)in[local_2c] * 2147483648.0;
    if (x < 2147483647.0) {
      if (-2147483648.0 < x) {
        iVar1 = psf_lrint(x);
        out[local_2c] = iVar1;
      }
      else {
        out[local_2c] = -0x80000000;
      }
    }
    else {
      out[local_2c] = 0x7fffffff;
    }
  }
  return;
}

Assistant:

void
src_float_to_int_array (const float *in, int *out, int len)
{	double scaled_value ;

	for (int i = 0 ; i < len ; i++)
	{	scaled_value = in [i] * (8.0 * 0x10000000) ;
#if CPU_CLIPS_POSITIVE == 0
		if (scaled_value >= (1.0 * 0x7FFFFFFF))
		{	out [i] = 0x7fffffff ;
			continue ;
			} ;
#endif
#if CPU_CLIPS_NEGATIVE == 0
		if (scaled_value <= (-8.0 * 0x10000000))
		{	out [i] = -1 - 0x7fffffff ;
			continue ;
			} ;
#endif
		out [i] = (int) psf_lrint (scaled_value) ;
		} ;

}